

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# URI.cpp
# Opt level: O0

URI * jaegertracing::net::URI::parse(URI *__return_storage_ptr__,string *uriStr)

{
  size_type sVar1;
  const_reference pvVar2;
  long lVar3;
  string_type local_2c8;
  string_type local_2a8;
  istringstream local_288 [8];
  istringstream iss;
  string local_108 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> portStr;
  size_type colonPos;
  string_type authority;
  int kQueryIndex;
  int kPathIndex;
  int kAuthorityIndex;
  int kSchemeIndex;
  smatch match;
  undefined1 local_40 [8];
  regex uriRegex;
  string *uriStr_local;
  URI *uri;
  
  uriRegex._M_automaton.
  super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi._7_1_ = 0;
  URI(__return_storage_ptr__);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_40,
             "^(([^:/?#]+):)?(//([^/?#]*))?([^?#]*)(\\?([^#]*))?(#(.*))?",0x40);
  std::__cxx11::
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::match_results((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   *)&kAuthorityIndex);
  std::
  regex_match<std::char_traits<char>,std::allocator<char>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>>
            (uriStr,(match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     *)&kAuthorityIndex,
             (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_40,0);
  sVar1 = std::__cxx11::
          match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ::size((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  *)&kAuthorityIndex);
  if (6 < sVar1) {
    pvVar2 = std::__cxx11::
             match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             ::operator[]((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                           *)&kAuthorityIndex,2);
    std::__cxx11::
    sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::str((string_type *)((long)&authority.field_2 + 8),pvVar2);
    std::__cxx11::string::operator=
              ((string *)__return_storage_ptr__,(string *)(authority.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(authority.field_2._M_local_buf + 8));
    pvVar2 = std::__cxx11::
             match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             ::operator[]((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                           *)&kAuthorityIndex,4);
    std::__cxx11::
    sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::str((string_type *)&colonPos,pvVar2);
    lVar3 = std::__cxx11::string::find((char)&colonPos,0x3a);
    if (lVar3 == -1) {
      std::__cxx11::string::operator=((string *)&__return_storage_ptr__->_host,(string *)&colonPos);
    }
    else {
      std::__cxx11::string::substr((ulong)((long)&portStr.field_2 + 8),(ulong)&colonPos);
      std::__cxx11::string::operator=
                ((string *)&__return_storage_ptr__->_host,
                 (string *)(portStr.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(portStr.field_2._M_local_buf + 8));
      std::__cxx11::string::substr((ulong)local_108,(ulong)&colonPos);
      std::__cxx11::istringstream::istringstream(local_288,local_108,_S_in);
      std::istream::operator>>(local_288,&__return_storage_ptr__->_port);
      std::__cxx11::istringstream::~istringstream(local_288);
      std::__cxx11::string::~string(local_108);
    }
    pvVar2 = std::__cxx11::
             match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             ::operator[]((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                           *)&kAuthorityIndex,5);
    std::__cxx11::
    sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::str(&local_2a8,pvVar2);
    std::__cxx11::string::operator=((string *)&__return_storage_ptr__->_path,(string *)&local_2a8);
    std::__cxx11::string::~string((string *)&local_2a8);
    pvVar2 = std::__cxx11::
             match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             ::operator[]((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                           *)&kAuthorityIndex,7);
    std::__cxx11::
    sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::str(&local_2c8,pvVar2);
    std::__cxx11::string::operator=((string *)&__return_storage_ptr__->_query,(string *)&local_2c8);
    std::__cxx11::string::~string((string *)&local_2c8);
    uriRegex._M_automaton.
    super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi._7_1_ = 1;
    std::__cxx11::string::~string((string *)&colonPos);
    std::__cxx11::
    match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::~match_results((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      *)&kAuthorityIndex);
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
              ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_40);
    if ((uriRegex._M_automaton.
         super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi._7_1_ & 1) == 0) {
      ~URI(__return_storage_ptr__);
    }
    return __return_storage_ptr__;
  }
  __assert_fail("match.size() >= kQueryIndex",
                "/workspace/llm4binary/github/license_c_cmakelists/jaegertracing[P]jaeger-client-cpp/src/jaegertracing/net/URI.cpp"
                ,0x52,"static URI jaegertracing::net::URI::parse(const std::string &)");
}

Assistant:

URI URI::parse(const std::string& uriStr)
{
    // See https://tools.ietf.org/html/rfc3986 for explanation.
    URI uri;
    std::regex uriRegex(
        "^(([^:/?#]+):)?(//([^/?#]*))?([^?#]*)(\\?([^#]*))?(#(.*))?",
        std::regex::extended);
    std::smatch match;
    std::regex_match(uriStr, match, uriRegex);

    constexpr auto kSchemeIndex = 2;
    constexpr auto kAuthorityIndex = 4;
    constexpr auto kPathIndex = 5;
    constexpr auto kQueryIndex = 7;

    assert(match.size() >= kQueryIndex);

    uri._scheme = match[kSchemeIndex].str();

    const auto authority = match[kAuthorityIndex].str();
    const auto colonPos = authority.find(':');
    if (colonPos == std::string::npos) {
        uri._host = authority;
    }
    else {
        uri._host = authority.substr(0, colonPos);
        const auto portStr = authority.substr(colonPos + 1);
        std::istringstream iss(portStr);
        iss >> uri._port;
    }

    uri._path = match[kPathIndex].str();
    uri._query = match[kQueryIndex].str();

    return uri;
}